

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scan.hpp
# Opt level: O0

int * Omega_h::inclusive_scan<Omega_h::CastIterator<int,int>,int*>
                (CastIterator<int,_int> first,CastIterator<int,_int> last,int *result)

{
  long lVar1;
  long local_70;
  d_t i;
  value_type_conflict1 value;
  difference_type n;
  int *result_local;
  CastIterator<int,_int> last_local;
  CastIterator<int,_int> first_local;
  
  lVar1 = (long)last.ptr - (long)first.ptr >> 2;
  first_local.ptr = result;
  if (0 < lVar1) {
    i._4_4_ = *first.ptr;
    *result = i._4_4_;
    for (local_70 = 1; local_70 < lVar1; local_70 = local_70 + 1) {
      i._4_4_ = i._4_4_ + first.ptr[local_70];
      result[local_70] = i._4_4_;
    }
    first_local.ptr = result + lVar1;
  }
  return first_local.ptr;
}

Assistant:

OutputIterator inclusive_scan(
    InputIterator first, InputIterator last, OutputIterator result) {
  auto const n = last - first;
  if (n <= 0) return result;
  auto value = first[0];
  result[0] = value;
  using d_t = typename std::remove_const<decltype(n)>::type;
  for (d_t i = 1; i < n; ++i) {
    value = std::move(value) + first[i];
    result[i] = value;
  }
  return result + n;
}